

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
Am_Slot_Data::Am_Slot_Data
          (Am_Slot_Data *this,Am_Object_Data *object,Am_Slot_Key in_key,Am_Value_Type in_type)

{
  unsigned_short uVar1;
  ushort local_54;
  Am_Value_Type in_type_local;
  Am_Slot_Key in_key_local;
  Am_Object_Data *object_local;
  Am_Slot_Data *this_local;
  
  Am_Value::Am_Value(&this->super_Am_Value);
  this->context = object;
  am_CList::am_CList(&this->constraints);
  am_CList::am_CList(&this->dependencies);
  am_CList::am_CList(&this->invalid_constraints);
  this->key = in_key;
  if (object == (Am_Object_Data *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = object->default_bits;
  }
  this->enabled_demons = uVar1;
  this->queued_demons = 0;
  this->type_check = 0;
  *(ushort *)&this->field_0x38 = *(ushort *)&this->field_0x38 & 0xff00;
  if (object == (Am_Object_Data *)0x0) {
    local_54 = 0;
  }
  else {
    local_54 = (ushort)object->default_rule;
  }
  *(ushort *)&this->field_0x38 = *(ushort *)&this->field_0x38 & 0xfcff | (local_54 & 3) << 8;
  (this->super_Am_Value).value.wrapper_value = (Am_Wrapper *)0x0;
  (this->super_Am_Value).type = in_type;
  return;
}

Assistant:

Am_Slot_Data::Am_Slot_Data(Am_Object_Data *object, Am_Slot_Key in_key,
                           Am_Value_Type in_type)
    : context(object), key(in_key), flags(0),
      enabled_demons(object ? object->default_bits : 0),
      rule(object ? object->default_rule : Am_LOCAL), queued_demons(0),
      type_check(0)
{
  value.voidptr_value = nullptr;
  type = in_type;
}